

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnUUID::ColumnUUID(ColumnUUID *this,ColumnRef *data)

{
  uint uVar1;
  runtime_error *this_00;
  TypeRef TStack_28;
  
  Type::CreateUUID();
  Column::Column(&this->super_Column,&TStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&TStack_28.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnUUID_001868e0;
  Column::As<clickhouse::ColumnVector<unsigned_long>>((Column *)&this->data_);
  uVar1 = (*(((this->data_).
              super___shared_ptr<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_Column)._vptr_Column[6])();
  if ((uVar1 & 1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"number of entries must be even (two 64-bit numbers for each UUID)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ColumnUUID::ColumnUUID(ColumnRef data)
    : Column(Type::CreateUUID())
    , data_(data->As<ColumnUInt64>())
{
    if (data_->Size() % 2 != 0) {
        throw std::runtime_error("number of entries must be even (two 64-bit numbers for each UUID)");
    }
}